

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void readSocket(int sockfd,char *msg)

{
  uint uVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ssize_t sVar3;
  undefined4 uStack_18;
  int dim;
  
  _uStack_18 = in_RAX;
  uVar2 = recv(sockfd,&dim,4,0x100);
  if (((int)uVar2 < 0) || ((uVar2 & 0xfffffffc) == 0)) {
    perror_die("recv(dim)");
  }
  uVar1 = (uint)dim >> 0x18 | (dim & 0xff0000U) >> 8 | (dim & 0xff00U) << 8 | dim << 0x18;
  dim = uVar1;
  sVar3 = recv(sockfd,msg,(long)(int)uVar1,0x100);
  if ((-1 < (int)sVar3) && (dim <= (int)sVar3)) {
    return;
  }
  perror_die("recv(msg)");
}

Assistant:

void
readSocket(int sockfd, char* msg)
{
    int ret;    // return value
    int dim;    // dimension

    // receive and assign return value to ret for later check
    ret = recv(sockfd, (void*) &dim, sizeof(dim), MSG_WAITALL); // blocking function

    // check ret value
    if (ret < 0 || ret < sizeof(dim)) {
        perror_die("recv(dim)");
    }

    // endianess translation: network2host long
    dim = ntohl(dim);

    #if 0
        // clean data struct, causes a warning so i clean it in the main routine.
        memset(msg, '\0', sizeof(msg));
        // ./utils.h:162:34: warning: 'memset' call operates on objects of type 'char' while the size is based on a different type 'char *' [-Wsizeof-pointer-memaccess]
    #endif

    // get actual data from socket
    ret = recv(sockfd, (void*) msg, dim, MSG_WAITALL);

    // again, check return value
    if (ret < 0 || ret < dim) {
        perror_die("recv(msg)");
    }

    return;
}